

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O0

Material * vera::extractMaterial(Model *_model,Material *_material,Scene *_scene,bool _verbose)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  __type _Var9;
  mapped_type *ppMVar10;
  Model *pMVar11;
  double *pdVar12;
  const_reference pvVar13;
  ulong uVar14;
  ostream *poVar15;
  Image *pIVar16;
  const_reference pvVar17;
  reference pvVar18;
  Image *pIVar19;
  Texture *pTVar20;
  mapped_type *ppTVar21;
  undefined8 local_870;
  uint local_868;
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  Texture *local_818;
  Texture *texture_2;
  _Self local_808;
  string local_800;
  int local_7dc;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  undefined1 local_798 [8];
  string name_4;
  Image *image_4;
  string local_768 [39];
  allocator local_741;
  string local_740 [32];
  Texture *local_720;
  Texture *texture_1;
  _Self local_710;
  string local_708;
  int local_6e4;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  undefined1 local_6a0 [8];
  string name_3;
  Image *image_3;
  string local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [32];
  const_reference local_600;
  Image *occlussionImage;
  Texture *texture;
  _Self local_5e8;
  string local_5e0;
  int local_5bc;
  string local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  string name_2;
  Image *image_2;
  Texture tex_1;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  byte local_409;
  undefined1 local_408 [7];
  bool isOcclusionRoughnessMetallic;
  allocator local_3f9;
  string local_3f8;
  undefined1 local_3d8 [8];
  vector<double,_std::allocator<double>_> c_1;
  string local_3b8 [32];
  _Self local_398;
  _Self local_390;
  allocator local_381;
  string local_380;
  Image *local_360;
  Image *img_1;
  int local_334;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  string name_1;
  Image *image_1;
  string local_2c0 [36];
  vec<4,_float,_(glm::qualifier)0> local_29c;
  allocator local_289;
  string local_288;
  undefined1 local_268 [8];
  vector<double,_std::allocator<double>_> c;
  string local_248 [32];
  _Self local_228;
  _Self local_220;
  allocator local_211;
  string local_210;
  Image *local_1f0;
  Image *img;
  int local_1c4;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string name;
  Image *image;
  Texture *tex;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Model *local_c0;
  Material *mat;
  int texCounter;
  _Self local_a8 [3];
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string mat_name;
  bool _verbose_local;
  Scene *_scene_local;
  Material *_material_local;
  Model *_model_local;
  
  mat_name.field_2._M_local_buf[0xf] = _verbose;
  purifyString(&local_90,&_material->name);
  toUnderscore(&local_70,&local_90);
  toLower((string *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  local_a8[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
       ::find(&_scene->materials,(key_type *)local_50);
  _texCounter = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                ::end(&_scene->materials);
  bVar8 = std::operator!=(local_a8,(_Self *)&texCounter);
  if (bVar8) {
    ppMVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](&_scene->materials,(key_type *)local_50);
    _model_local = (Model *)*ppMVar10;
  }
  else {
    mat._0_4_ = 0;
    pMVar11 = (Model *)operator_new(0x150);
    Material::Material((Material *)pMVar11,(string *)local_50);
    local_c0 = pMVar11;
    toUpper(&local_100,
            (string *)
            &(pMVar11->buffers).
             super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_e0,"MATERIAL_NAME_",&local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"",&local_121);
    (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,&local_e0,local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    pMVar11 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"MATERIAL_BASECOLOR",(allocator *)((long)&tex + 7));
    pdVar12 = std::vector<double,_std::allocator<double>_>::data
                        (&(_material->pbrMetallicRoughness).baseColorFactor);
    (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[9])(pMVar11,local_148,pdVar12,4);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tex + 7));
    if ((_material->pbrMetallicRoughness).baseColorTexture.index < 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_268,
                 &(_material->pbrMetallicRoughness).baseColorFactor);
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,"diffuse",&local_289);
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_268,0);
      dVar3 = *pvVar18;
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_268,1);
      dVar2 = *pvVar18;
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_268,2);
      dVar1 = *pvVar18;
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_268,3);
      glm::vec<4,_float,_(glm::qualifier)0>::vec
                (&local_29c,(float)dVar3,(float)dVar2,(float)dVar1,(float)*pvVar18);
      Material::set((Material *)pMVar11,&local_288,&local_29c);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_268);
    }
    else {
      pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                          (&_model->textures,
                           (long)(_material->pbrMetallicRoughness).baseColorTexture.index);
      name.field_2._8_8_ =
           std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                     (&_model->images,(long)pvVar13->source);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name.field_2._8_8_,&((const_reference)name.field_2._8_8_)->uri);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        local_1c4 = (int)mat;
        mat._0_4_ = (int)mat + 1;
        toString<int>(&local_1c0,&local_1c4);
        std::operator+(&local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_1c0);
        std::__cxx11::string::operator=((string *)local_180,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      getUniformName((string *)&img,(string *)local_180);
      std::__cxx11::string::operator=((string *)local_180,(string *)&img);
      std::__cxx11::string::~string((string *)&img);
      if ((mat_name.field_2._M_local_buf[0xf] & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar15 = std::operator<<(poVar15,(string *)local_50);
        poVar15 = std::operator<<(poVar15," BASECOLORMAP as ");
        poVar15 = std::operator<<(poVar15,(string *)local_180);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      pIVar16 = (Image *)operator_new(0x70);
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (name.field_2._8_8_ + 0x38),0);
      Image::Image(pIVar16,pvVar17,*(int *)(name.field_2._8_8_ + 0x20),
                   *(int *)(name.field_2._8_8_ + 0x24),*(int *)(name.field_2._8_8_ + 0x28));
      local_1f0 = pIVar16;
      std::__cxx11::string::operator=((string *)&pIVar16->name,(string *)local_180);
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"diffuse",&local_211);
      Material::set((Material *)pMVar11,&local_210,local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      local_220._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::find(&_scene->textures,(key_type *)local_180);
      local_228._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::end(&_scene->textures);
      bVar8 = std::operator==(&local_220,&local_228);
      if (bVar8) {
        pTVar20 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar20,local_1f0,LINEAR,REPEAT);
        ppTVar21 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)local_180);
        *ppTVar21 = pTVar20;
      }
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_248,"MATERIAL_BASECOLORMAP",
                 (allocator *)
                 ((long)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_248,local_180);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string((string *)local_180);
    }
    pMVar11 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"MATERIAL_EMISSIVE",(allocator *)((long)&image_1 + 7));
    pdVar12 = std::vector<double,_std::allocator<double>_>::data(&_material->emissiveFactor);
    (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[9])(pMVar11,local_2c0,pdVar12,3);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&image_1 + 7));
    if ((_material->emissiveTexture).index < 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_3d8,&_material->emissiveFactor);
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f8,"emissive",&local_3f9);
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_3d8,0);
      dVar3 = *pvVar18;
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_3d8,1);
      dVar2 = *pvVar18;
      pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_3d8,2);
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                ((vec<3,_float,_(glm::qualifier)0> *)local_408,(float)dVar3,(float)dVar2,
                 (float)*pvVar18);
      Material::set((Material *)pMVar11,&local_3f8,(vec3 *)local_408);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_3d8);
    }
    else {
      pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                          (&_model->textures,(long)(_material->emissiveTexture).index);
      name_1.field_2._8_8_ =
           std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                     (&_model->images,(long)pvVar13->source);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name_1.field_2._8_8_,&((const_reference)name_1.field_2._8_8_)->uri);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        local_334 = (int)mat;
        mat._0_4_ = (int)mat + 1;
        toString<int>(&local_330,&local_334);
        std::operator+(&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_330);
        std::__cxx11::string::operator=((string *)local_2f0,(string *)&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
      }
      getUniformName((string *)&img_1,(string *)local_2f0);
      std::__cxx11::string::operator=((string *)local_2f0,(string *)&img_1);
      std::__cxx11::string::~string((string *)&img_1);
      pIVar16 = (Image *)operator_new(0x70);
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (name_1.field_2._8_8_ + 0x38),0);
      Image::Image(pIVar16,pvVar17,*(int *)(name_1.field_2._8_8_ + 0x20),
                   *(int *)(name_1.field_2._8_8_ + 0x24),*(int *)(name_1.field_2._8_8_ + 0x28));
      local_360 = pIVar16;
      std::__cxx11::string::operator=((string *)&pIVar16->name,(string *)local_2f0);
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_380,"emissive",&local_381);
      Material::set((Material *)pMVar11,&local_380,local_360);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      if ((mat_name.field_2._M_local_buf[0xf] & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar15 = std::operator<<(poVar15,(string *)local_2f0);
        poVar15 = std::operator<<(poVar15,"for EMISSIVEMAP as ");
        poVar15 = std::operator<<(poVar15,(string *)local_2f0);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      local_390._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::find(&_scene->textures,(key_type *)local_2f0);
      local_398._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::end(&_scene->textures);
      bVar8 = std::operator==(&local_390,&local_398);
      if (bVar8) {
        pTVar20 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar20,local_360,LINEAR,REPEAT);
        ppTVar21 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)local_2f0);
        *ppTVar21 = pTVar20;
      }
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3b8,"MATERIAL_EMISSIVEMAP",
                 (allocator *)
                 ((long)&c_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_3b8,local_2f0);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&c_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string((string *)local_2f0);
    }
    pMVar11 = local_c0;
    local_409 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"MATERIAL_ROUGHNESS",&local_431);
    (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[4])
              ((_material->pbrMetallicRoughness).roughnessFactor,pMVar11,local_430);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    pMVar11 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_458,"MATERIAL_METALLIC",
               (allocator *)
               ((long)&tex_1.extensions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[4])
              ((_material->pbrMetallicRoughness).metallicFactor,pMVar11,local_458);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tex_1.extensions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    if (-1 < (_material->pbrMetallicRoughness).metallicRoughnessTexture.index) {
      pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                          (&_model->textures,
                           (long)(_material->pbrMetallicRoughness).metallicRoughnessTexture.index);
      tinygltf::Texture::Texture((Texture *)&image_2,pvVar13);
      name_2.field_2._8_8_ =
           std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                     (&_model->images,(long)(int)tex_1.name.field_2._12_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name_2.field_2._8_8_,&((const_reference)name_2.field_2._8_8_)->uri);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        local_5bc = (int)mat;
        mat._0_4_ = (int)mat + 1;
        toString<int>(&local_5b8,&local_5bc);
        std::operator+(&local_598,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_5b8);
        std::__cxx11::string::operator=((string *)local_578,(string *)&local_598);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_5b8);
      }
      getUniformName(&local_5e0,(string *)local_578);
      std::__cxx11::string::operator=((string *)local_578,(string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      if ((mat_name.field_2._M_local_buf[0xf] & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar15 = std::operator<<(poVar15,(string *)local_578);
        poVar15 = std::operator<<(poVar15,"for METALLICROUGHNESSMAP as ");
        poVar15 = std::operator<<(poVar15,(string *)local_578);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      local_5e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::find(&_scene->textures,(key_type *)local_578);
      texture = (Texture *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                ::end(&_scene->textures);
      bVar8 = std::operator==(&local_5e8,(_Self *)&texture);
      if (bVar8) {
        pIVar19 = (Image *)operator_new(0x48);
        Texture::Texture((Texture *)pIVar19);
        uVar4 = *(uint *)(name_2.field_2._8_8_ + 0x20);
        uVar5 = *(uint *)(name_2.field_2._8_8_ + 0x24);
        uVar6 = *(uint *)(name_2.field_2._8_8_ + 0x28);
        uVar7 = *(uint *)(name_2.field_2._8_8_ + 0x2c);
        occlussionImage = pIVar19;
        pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (name_2.field_2._8_8_ + 0x38),0);
        (*(*(_func_int ***)&pIVar19->name)[6])
                  (pIVar19,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,pvVar17,0,0);
        pIVar19 = occlussionImage;
        ppTVar21 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)local_578);
        *ppTVar21 = (mapped_type)pIVar19;
      }
      if (-1 < (_material->occlusionTexture).index) {
        pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                            (&_model->textures,(long)(_material->occlusionTexture).index);
        local_600 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                              (&_model->images,(long)pvVar13->source);
        bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(name_2.field_2._8_8_ + 0x78),"");
        if ((bVar8) &&
           (_Var9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(name_2.field_2._8_8_ + 0x78),&local_600->uri), _Var9)) {
          local_409 = 1;
        }
      }
      pMVar11 = local_c0;
      if ((local_409 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_670,"MATERIAL_ROUGHNESSMETALLICMAP",(allocator *)((long)&image_3 + 7));
        (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_670,local_578);
        std::__cxx11::string::~string(local_670);
        std::allocator<char>::~allocator((allocator<char> *)((long)&image_3 + 7));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_620,"MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP",&local_621);
        (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_620,local_578);
        std::__cxx11::string::~string(local_620);
        std::allocator<char>::~allocator((allocator<char> *)&local_621);
        pMVar11 = local_c0;
        dVar3 = (_material->occlusionTexture).strength;
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_648,"MATERIAL_OCCLUSIONMAP_STRENGTH",&local_649);
          (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[4])
                    ((_material->occlusionTexture).strength,pMVar11,local_648);
          std::__cxx11::string::~string(local_648);
          std::allocator<char>::~allocator((allocator<char> *)&local_649);
        }
      }
      std::__cxx11::string::~string((string *)local_578);
      tinygltf::Texture::~Texture((Texture *)&image_2);
    }
    if (((local_409 & 1) == 0) && (-1 < (_material->occlusionTexture).index)) {
      pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                          (&_model->textures,(long)(_material->occlusionTexture).index);
      name_3.field_2._8_8_ =
           std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                     (&_model->images,(long)pvVar13->source);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name_3.field_2._8_8_,&((const_reference)name_3.field_2._8_8_)->uri);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        local_6e4 = (int)mat;
        mat._0_4_ = (int)mat + 1;
        toString<int>(&local_6e0,&local_6e4);
        std::operator+(&local_6c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_6e0);
        std::__cxx11::string::operator=((string *)local_6a0,(string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6e0);
      }
      getUniformName(&local_708,(string *)local_6a0);
      std::__cxx11::string::operator=((string *)local_6a0,(string *)&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      if ((mat_name.field_2._M_local_buf[0xf] & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar15 = std::operator<<(poVar15,(string *)local_6a0);
        poVar15 = std::operator<<(poVar15,"for OCCLUSIONMAP as ");
        poVar15 = std::operator<<(poVar15,(string *)local_6a0);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      local_710._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::find(&_scene->textures,(key_type *)local_6a0);
      texture_1 = (Texture *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                  ::end(&_scene->textures);
      bVar8 = std::operator==(&local_710,(_Self *)&texture_1);
      if (bVar8) {
        pTVar20 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar20);
        uVar4 = *(uint *)(name_3.field_2._8_8_ + 0x20);
        uVar5 = *(uint *)(name_3.field_2._8_8_ + 0x24);
        uVar6 = *(uint *)(name_3.field_2._8_8_ + 0x28);
        uVar7 = *(uint *)(name_3.field_2._8_8_ + 0x2c);
        local_720 = pTVar20;
        pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (name_3.field_2._8_8_ + 0x38),0);
        (*pTVar20->_vptr_Texture[6])
                  (pTVar20,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,pvVar17,0,0);
        pTVar20 = local_720;
        ppTVar21 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)local_6a0);
        *ppTVar21 = pTVar20;
      }
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_740,"MATERIAL_OCCLUSIONMAP",&local_741);
      (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_740,local_6a0);
      std::__cxx11::string::~string(local_740);
      std::allocator<char>::~allocator((allocator<char> *)&local_741);
      pMVar11 = local_c0;
      dVar3 = (_material->occlusionTexture).strength;
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_768,"MATERIAL_OCCLUSIONMAP_STRENGTH",(allocator *)((long)&image_4 + 7));
        (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[4])
                  ((_material->occlusionTexture).strength,pMVar11,local_768);
        std::__cxx11::string::~string(local_768);
        std::allocator<char>::~allocator((allocator<char> *)((long)&image_4 + 7));
      }
      std::__cxx11::string::~string((string *)local_6a0);
    }
    if (-1 < (_material->normalTexture).index) {
      pvVar13 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[]
                          (&_model->textures,(long)(_material->normalTexture).index);
      name_4.field_2._8_8_ =
           std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                     (&_model->images,(long)pvVar13->source);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name_4.field_2._8_8_,&((const_reference)name_4.field_2._8_8_)->uri);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        local_7dc = (int)mat;
        mat._0_4_ = (int)mat + 1;
        toString<int>(&local_7d8,&local_7dc);
        std::operator+(&local_7b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,&local_7d8);
        std::__cxx11::string::operator=((string *)local_798,(string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::__cxx11::string::~string((string *)&local_7d8);
      }
      getUniformName(&local_800,(string *)local_798);
      std::__cxx11::string::operator=((string *)local_798,(string *)&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      if ((mat_name.field_2._M_local_buf[0xf] & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar15 = std::operator<<(poVar15,(string *)local_798);
        poVar15 = std::operator<<(poVar15,"for NORMALMAP as ");
        poVar15 = std::operator<<(poVar15,(string *)local_798);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      local_808._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
           ::find(&_scene->textures,(key_type *)local_798);
      texture_2 = (Texture *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                  ::end(&_scene->textures);
      bVar8 = std::operator==(&local_808,(_Self *)&texture_2);
      if (bVar8) {
        pTVar20 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar20);
        uVar4 = *(uint *)(name_4.field_2._8_8_ + 0x20);
        uVar5 = *(uint *)(name_4.field_2._8_8_ + 0x24);
        uVar6 = *(uint *)(name_4.field_2._8_8_ + 0x28);
        uVar7 = *(uint *)(name_4.field_2._8_8_ + 0x2c);
        local_818 = pTVar20;
        pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (name_4.field_2._8_8_ + 0x38),0);
        (*pTVar20->_vptr_Texture[6])
                  (pTVar20,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,pvVar17,0,0);
        pTVar20 = local_818;
        ppTVar21 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)local_798);
        *ppTVar21 = pTVar20;
      }
      pMVar11 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_838,"MATERIAL_NORMALMAP",&local_839);
      (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[10])(pMVar11,local_838,local_798);
      std::__cxx11::string::~string(local_838);
      std::allocator<char>::~allocator((allocator<char> *)&local_839);
      pMVar11 = local_c0;
      dVar3 = (_material->normalTexture).scale;
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_860,"MATERIAL_NORMALMAP_SCALE",&local_861);
        dVar3 = (_material->normalTexture).scale;
        glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_870,dVar3,dVar3,1.0);
        (*((HaveDefines *)&pMVar11->accessors)->_vptr_HaveDefines[6])
                  (local_870,(ulong)local_868,pMVar11,local_860);
        std::__cxx11::string::~string(local_860);
        std::allocator<char>::~allocator((allocator<char> *)&local_861);
      }
      std::__cxx11::string::~string((string *)local_798);
    }
    _model_local = local_c0;
  }
  mat._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return (Material *)_model_local;
}

Assistant:

Material* extractMaterial(const tinygltf::Model& _model, const tinygltf::Material& _material, Scene* _scene, bool _verbose) {
    std::string mat_name = toLower( toUnderscore( purifyString( _material.name ) ) );

    if (_scene->materials.find(mat_name) != _scene->materials.end())
        return _scene->materials[mat_name];
        
    int texCounter = 0;
    Material* mat = new Material(mat_name);

    mat->addDefine("MATERIAL_NAME_" + toUpper(mat->name) );
    mat->addDefine("MATERIAL_BASECOLOR", (double*)_material.pbrMetallicRoughness.baseColorFactor.data(), 4);
    if (_material.pbrMetallicRoughness.baseColorTexture.index >= 0) {
        const tinygltf::Texture &tex = _model.textures[_material.pbrMetallicRoughness.baseColorTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << mat_name << " BASECOLORMAP as " << name << std::endl;

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("diffuse", img);

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);

        mat->addDefine("MATERIAL_BASECOLORMAP", name);
    } 
    else {
        std::vector<double> c = _material.pbrMetallicRoughness.baseColorFactor;
        mat->set("diffuse", glm::vec4(float(c[0]), float(c[1]), float(c[2]), float(c[3])));
    }

    mat->addDefine("MATERIAL_EMISSIVE", (double*)_material.emissiveFactor.data(), 3);
    if (_material.emissiveTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.emissiveTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("emissive", img);

        if (_verbose)
            std::cout << "Loading " << name << "for EMISSIVEMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);
        
        mat->addDefine("MATERIAL_EMISSIVEMAP", name);
    }
    else {
        std::vector<double> c = _material.emissiveFactor;
        mat->set("emissive", glm::vec3(float(c[0]), float(c[1]), float(c[2])));
    }

    bool isOcclusionRoughnessMetallic = false;
    mat->addDefine("MATERIAL_ROUGHNESS", _material.pbrMetallicRoughness.roughnessFactor);
    mat->addDefine("MATERIAL_METALLIC", _material.pbrMetallicRoughness.metallicFactor);
    if (_material.pbrMetallicRoughness.metallicRoughnessTexture.index >= 0) {
        tinygltf::Texture tex = _model.textures[_material.pbrMetallicRoughness.metallicRoughnessTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for METALLICROUGHNESSMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }

        if (_material.occlusionTexture.index >= 0) {
            const tinygltf::Image &occlussionImage = _model.images[_model.textures[_material.occlusionTexture.index].source];
            if (image.uri != "" && image.uri == occlussionImage.uri)
                isOcclusionRoughnessMetallic = true;
        }

        if (isOcclusionRoughnessMetallic) {
            mat->addDefine("MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP", name);
            if (_material.occlusionTexture.strength != 1.0)
                mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
        }
        else
            mat->addDefine("MATERIAL_ROUGHNESSMETALLICMAP", name);
    }

     // OCCLUSION
    if (!isOcclusionRoughnessMetallic && _material.occlusionTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.occlusionTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for OCCLUSIONMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_OCCLUSIONMAP", name);

        if (_material.occlusionTexture.strength != 1.0)
            mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
    }

    // NORMALMAP
    if (_material.normalTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.normalTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for NORMALMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_NORMALMAP", name);

        if (_material.normalTexture.scale != 1.0)
            mat->addDefine("MATERIAL_NORMALMAP_SCALE", glm::vec3(_material.normalTexture.scale, _material.normalTexture.scale, 1.0));
    }

    return mat;
}